

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  double dVar1;
  xmlXPathObjectPtr *ppxVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  xmlXPathObjectPtr pxVar9;
  xmlChar *pxVar10;
  xmlXPathObjectPtr pxVar11;
  xmlChar *val;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double local_48;
  
  if ((nargs < 2) || (3 < (uint)nargs)) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    iVar13 = 0xc;
    goto LAB_001c3312;
  }
  local_48 = 0.0;
  if (nargs == 3) {
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      if (ctxt->value->type != XPATH_NUMBER) {
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER))
        goto LAB_001c330a;
      }
      iVar13 = ctxt->valueNr;
      if ((long)iVar13 < 1) {
        pxVar11 = (xmlXPathObjectPtr)0x0;
      }
      else {
        uVar7 = iVar13 - 1;
        ctxt->valueNr = uVar7;
        ppxVar2 = ctxt->valueTab;
        if (iVar13 == 1) {
          pxVar11 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar11 = ppxVar2[(long)iVar13 + -2];
        }
        ctxt->value = pxVar11;
        pxVar11 = ppxVar2[uVar7];
        ppxVar2[uVar7] = (xmlXPathObjectPtr)0x0;
      }
      local_48 = pxVar11->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar11);
      goto LAB_001c3247;
    }
  }
  else {
LAB_001c3247:
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      if (ctxt->value->type != XPATH_NUMBER) {
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER))
        goto LAB_001c330a;
      }
      iVar13 = ctxt->valueNr;
      if ((long)iVar13 < 1) {
        pxVar11 = (xmlXPathObjectPtr)0x0;
      }
      else {
        uVar7 = iVar13 - 1;
        ctxt->valueNr = uVar7;
        ppxVar2 = ctxt->valueTab;
        if (iVar13 == 1) {
          pxVar11 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar11 = ppxVar2[(long)iVar13 + -2];
        }
        ctxt->value = pxVar11;
        pxVar11 = ppxVar2[uVar7];
        ppxVar2[uVar7] = (xmlXPathObjectPtr)0x0;
      }
      dVar1 = pxVar11->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar11);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (ctxt->value->type == XPATH_STRING) {
LAB_001c32ee:
          iVar13 = ctxt->valueNr;
          if ((long)iVar13 < 1) {
            pxVar11 = (xmlXPathObjectPtr)0x0;
          }
          else {
            uVar7 = iVar13 - 1;
            ctxt->valueNr = uVar7;
            ppxVar2 = ctxt->valueTab;
            if (iVar13 == 1) {
              pxVar11 = (xmlXPathObjectPtr)0x0;
            }
            else {
              pxVar11 = ppxVar2[(long)iVar13 + -2];
            }
            ctxt->value = pxVar11;
            pxVar11 = ppxVar2[uVar7];
            ppxVar2[uVar7] = (xmlXPathObjectPtr)0x0;
          }
          iVar13 = 0x7fffffff;
          if ((dVar1 < 2147483647.0) && (iVar13 = 1, 1.0 <= dVar1)) {
            iVar13 = (int)dVar1;
            dVar4 = floor(dVar1);
            if (0.5 <= dVar1 - dVar4) {
              iVar13 = iVar13 + 1;
            }
          }
          iVar12 = 0x7ffffffe;
          if (nargs == 3) {
            dVar4 = floor(dVar1);
            dVar5 = floor(local_48);
            uVar14 = -(ulong)(local_48 - dVar5 < 0.5);
            uVar15 = -(ulong)(dVar1 - dVar4 < 0.5);
            uVar6 = (ulong)dVar4 & uVar15;
            auVar16._0_8_ = ~uVar14 & (ulong)(dVar5 + 1.0);
            auVar16._8_8_ = ~uVar15 & (ulong)(dVar4 + 1.0);
            auVar3._8_4_ = (int)uVar6;
            auVar3._0_8_ = (ulong)dVar5 & uVar14;
            auVar3._12_4_ = (int)(uVar6 >> 0x20);
            dVar1 = SUB168(auVar16 | auVar3,8) + SUB168(auVar16 | auVar3,0);
            iVar12 = 0;
            if ((1.0 <= dVar1) && (iVar12 = 0x7ffffffe, dVar1 < 2147483647.0)) {
              iVar12 = (int)dVar1 + -1;
            }
          }
          if ((iVar12 < iVar13) || (iVar8 = xmlUTF8Strlen(pxVar11->stringval), iVar8 < iVar13)) {
            pxVar9 = xmlXPathCacheNewString(ctxt,"");
            valuePush(ctxt,pxVar9);
          }
          else {
            pxVar10 = xmlUTF8Strsub(pxVar11->stringval,iVar13 + -1,iVar12 - (iVar13 + -1));
            val = pxVar10;
            if (pxVar10 == (xmlChar *)0x0) {
              xmlXPathPErrMemory(ctxt);
              val = (xmlChar *)0x0;
            }
            pxVar9 = xmlXPathCacheNewString(ctxt,val);
            valuePush(ctxt,pxVar9);
            (*xmlFree)(pxVar10);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar11);
          return;
        }
        xmlXPathStringFunction(ctxt,1);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING))
        goto LAB_001c32ee;
      }
    }
  }
LAB_001c330a:
  iVar13 = 0xb;
LAB_001c3312:
  xmlXPathErr(ctxt,iVar13);
  return;
}

Assistant:

void
xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str, start, len;
    double le=0, in;
    int i = 1, j = INT_MAX;

    if (nargs < 2) {
	CHECK_ARITY(2);
    }
    if (nargs > 3) {
	CHECK_ARITY(3);
    }
    /*
     * take care of possible last (position) argument
    */
    if (nargs == 3) {
	CAST_TO_NUMBER;
	CHECK_TYPE(XPATH_NUMBER);
	len = valuePop(ctxt);
	le = len->floatval;
	xmlXPathReleaseObject(ctxt->context, len);
    }

    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    start = valuePop(ctxt);
    in = start->floatval;
    xmlXPathReleaseObject(ctxt->context, start);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    str = valuePop(ctxt);

    if (!(in < INT_MAX)) { /* Logical NOT to handle NaNs */
        i = INT_MAX;
    } else if (in >= 1.0) {
        i = (int)in;
        if (in - floor(in) >= 0.5)
            i += 1;
    }

    if (nargs == 3) {
        double rin, rle, end;

        rin = floor(in);
        if (in - rin >= 0.5)
            rin += 1.0;

        rle = floor(le);
        if (le - rle >= 0.5)
            rle += 1.0;

        end = rin + rle;
        if (!(end >= 1.0)) { /* Logical NOT to handle NaNs */
            j = 1;
        } else if (end < INT_MAX) {
            j = (int)end;
        }
    }

    i -= 1;
    j -= 1;

    if ((i < j) && (i < xmlUTF8Strlen(str->stringval))) {
        xmlChar *ret = xmlUTF8Strsub(str->stringval, i, j - i);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);
	valuePush(ctxt, xmlXPathCacheNewString(ctxt, ret));
	xmlFree(ret);
    } else {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    }

    xmlXPathReleaseObject(ctxt->context, str);
}